

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptNativeFloatArray * __thiscall
Js::JavascriptLibrary::CreateNativeFloatArrayLiteral(JavascriptLibrary *this,uint32 length)

{
  DynamicType *arrayType;
  code *pcVar1;
  bool bVar2;
  DynamicType **ppDVar3;
  undefined4 *puVar4;
  Recycler *recycler;
  JavascriptArray *this_00;
  JavascriptNativeFloatArray *arr;
  uint32 length_local;
  JavascriptLibrary *this_local;
  
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->nativeFloatArrayType);
  if (*ppDVar3 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x177e,"(nativeFloatArrayType)","Where\'s arrayType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->nativeFloatArrayType);
  arrayType = *ppDVar3;
  recycler = GetRecycler(this);
  this_00 = (JavascriptArray *)
            Js::JavascriptArray::NewLiteral<double,Js::JavascriptNativeFloatArray,0u>
                      (length,arrayType,recycler);
  Js::JavascriptArray::CheckForceES5Array(this_00);
  return (JavascriptNativeFloatArray *)this_00;
}

Assistant:

JavascriptNativeFloatArray* JavascriptLibrary::CreateNativeFloatArrayLiteral(uint32 length)
    {
        AssertMsg(nativeFloatArrayType, "Where's arrayType?");
        JavascriptNativeFloatArray* arr = JavascriptArray::NewLiteral<double, JavascriptNativeFloatArray, 0>(length, nativeFloatArrayType, this->GetRecycler());
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_ARRAY(arr));

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif
        return arr;
    }